

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

Vec_Int_t * Wln_NtkRetime(Wln_Ntk_t *pNtk,int fSkipSimple,int fVerbose)

{
  Vec_Int_t *vSet;
  Vec_Int_t *vVec1;
  int *piVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Wln_Ret_t *p;
  Vec_Int_t *vSet_00;
  Vec_Int_t *vVec;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  char *__s;
  int iVar10;
  uint uVar11;
  uint nMoves;
  int iVar12;
  bool bVar13;
  bool bVar14;
  int local_98;
  int local_88;
  int local_84;
  Vec_Int_t t;
  
  p = Wln_RetAlloc(pNtk);
  vSet_00 = &p->vSources;
  vSet = &p->vSinks;
  vVec1 = &p->vFront;
  vVec = Vec_IntAlloc(0);
  Wln_RetPrint(p,fVerbose);
  Wln_RetMarkChanges(p,(Vec_Int_t *)0x0);
  iVar4 = Wln_RetPropDelay(p);
  p->DelayMax = iVar4;
  Wln_RetFindSources(p);
  Wln_RetAddToMoves(p,(Vec_Int_t *)0x0,p->DelayMax,0,0,fSkipSimple,fVerbose);
  local_88 = 0;
  bVar3 = 0;
  iVar12 = 0;
  uVar11 = 0;
  nMoves = 0;
  local_98 = iVar4;
  do {
    if ((p->vSources).nSize == 0) {
      if ((p->vSinks).nSize == 0) goto LAB_00302e89;
      local_84 = p->DelayMax;
      bVar13 = false;
LAB_00302c24:
      pVVar8 = vSet;
      iVar5 = Wln_RetCheckBackward(p,vSet);
      iVar6 = (int)pVVar8;
      bVar14 = iVar5 != 0;
    }
    else {
      local_84 = p->DelayMax;
      pVVar8 = vSet_00;
      iVar5 = Wln_RetCheckForward(p,vSet_00);
      iVar6 = (int)pVVar8;
      bVar13 = iVar5 != 0;
      if ((p->vSinks).nSize != 0) goto LAB_00302c24;
      bVar14 = false;
    }
    Vec_IntSort(vSet_00,iVar6);
    Vec_IntSort(vSet,iVar6);
    if (!(bool)(bVar13 | bVar14)) {
      __s = "Cannot retime forward and backward.";
LAB_00302e7a:
      puts(__s);
LAB_00302e89:
      iVar5 = vVec->nCap;
      iVar6 = vVec->nSize;
      piVar1 = vVec->pArray;
      iVar12 = (p->vMoves).nSize;
      piVar2 = (p->vMoves).pArray;
      vVec->nCap = (p->vMoves).nCap;
      vVec->nSize = iVar12;
      vVec->pArray = piVar2;
      (p->vMoves).nCap = iVar5;
      (p->vMoves).nSize = iVar6;
      (p->vMoves).pArray = piVar1;
      Wln_RetFree(p);
      if (fVerbose == 0) {
        printf("Retiming instruction contains %d moves and %d total retimed objects.\n",
               (ulong)nMoves,(ulong)((vVec->nSize + nMoves * -2) - 2));
        printf("Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n",
               SUB84(((double)(iVar4 - local_98) * 100.0) / (double)iVar4,0));
      }
      else {
        puts("\nThe resulting moves recorded in terms of name IDs of the NDR nodes:");
        Vec_IntPrint(vVec);
      }
      return vVec;
    }
    piVar7 = (p->vSources).pArray;
    piVar9 = (p->vSinks).pArray;
    iVar5 = (p->vSources).nSize;
    piVar1 = piVar7 + iVar5;
    iVar6 = (p->vSinks).nSize;
    piVar2 = piVar9 + iVar6;
    iVar10 = 0;
    while ((piVar7 < piVar1 && (piVar9 < piVar2))) {
      if (*piVar7 == *piVar9) {
        piVar7 = piVar7 + 1;
        piVar9 = piVar9 + 1;
        iVar10 = iVar10 + 1;
      }
      else if (*piVar7 < *piVar9) {
        piVar7 = piVar7 + 1;
      }
      else {
        piVar9 = piVar9 + 1;
      }
    }
    if (iVar10 != 0) {
      __s = "Cannot reduce delay by retiming.";
      goto LAB_00302e7a;
    }
    (p->vFront).nSize = 0;
    if (((bool)(local_88 != 0 & bVar13)) ||
       ((!(bool)(bVar3 & bVar14) &&
        ((bVar13 == true && bVar14 == false || ((bool)(iVar5 < iVar6 & bVar13 & bVar14))))))) {
      Vec_IntAppend(vVec1,vSet_00);
      Wln_RetMarkChanges(p,vVec1);
      Wln_RetRetimeForward(p,vVec1);
      iVar5 = 1;
      local_88 = iVar5;
    }
    else {
      Vec_IntAppend(vVec1,vSet);
      Wln_RetRetimeBackward(p,vVec1);
      Wln_RetMarkChanges(p,vVec1);
      iVar5 = 0;
      bVar3 = 1;
    }
    nMoves = nMoves + 1;
    iVar6 = Wln_RetPropDelay(p);
    if (iVar6 <= local_98) {
      local_98 = iVar6;
    }
    p->DelayMax = iVar6;
    if (fVerbose == 0) {
      Wln_RetAddToMoves(p,vVec1,iVar6,iVar5,nMoves,fSkipSimple,0);
    }
    else {
      putchar(10);
      Wln_RetAddToMoves(p,vVec1,p->DelayMax,iVar5,nMoves,fSkipSimple,fVerbose);
      printf("Sinks: ");
      Vec_IntPrint(vSet);
      printf("Sources: ");
      Vec_IntPrint(vSet_00);
    }
    bVar13 = 0 < iVar12;
    iVar12 = iVar12 + 1;
    if (p->DelayMax < local_84) {
      iVar12 = 0;
    }
    if ((3 < iVar12) || (uVar11 = uVar11 + (bVar13 && p->DelayMax < local_84), 5 < uVar11))
    goto LAB_00302e89;
    Wln_RetFindSources(p);
    iVar5 = (p->vEdgeLinks).nSize;
    if ((p->vEdgeLinks).nCap < iVar5 * 2) {
      Vec_IntGrow(&p->vEdgeLinks,iVar5 << 2);
    }
  } while( true );
}

Assistant:

Vec_Int_t * Wln_NtkRetime( Wln_Ntk_t * pNtk, int fSkipSimple, int fVerbose )
{
    Wln_Ret_t * p = Wln_RetAlloc( pNtk );
    Vec_Int_t * vSources = &p->vSources;
    Vec_Int_t * vSinks   = &p->vSinks;
    Vec_Int_t * vFront   = &p->vFront;
    Vec_Int_t * vMoves   = Vec_IntAlloc(0);
    int nMoves = 0, fPrevFwd = 0, fPrevBwd = 0, nCountIncrease = 0;
    int DelayInit = 0, DelayBest = 0, nChange = 0;
    Wln_RetPrint( p, fVerbose );
    Wln_RetMarkChanges( p, NULL );
    p->DelayMax = DelayInit = DelayBest = Wln_RetPropDelay( p );
    Wln_RetFindSources( p );
    Wln_RetAddToMoves( p, NULL, p->DelayMax, 0, nMoves, fSkipSimple, fVerbose );
    while ( Vec_IntSize(vSources) || Vec_IntSize(vSinks) )
    {
        int DelayMaxPrev = p->DelayMax;
        int fForward  = Vec_IntSize(vSources) && Wln_RetCheckForward( p, vSources );
        int fBackward = Vec_IntSize(vSinks)   && Wln_RetCheckBackward( p, vSinks );
        Vec_IntSort( vSources, 0 );
        Vec_IntSort( vSinks, 0 );

        if ( !fForward && !fBackward )
        {
            printf( "Cannot retime forward and backward.\n" );
            break;
        }
        if ( Vec_IntTwoCountCommon(vSources, vSinks) )
        {
            printf( "Cannot reduce delay by retiming.\n" );
            break;
        }
        nMoves++;
        Vec_IntClear( vFront );
        if ( (fPrevFwd && fForward) || (!(fPrevBwd && fBackward) && ((fForward && !fBackward) || (fForward && fBackward && Vec_IntSize(vSources) < Vec_IntSize(vSinks)))) )
        {
            Vec_IntAppend( vFront, vSources );
            Wln_RetMarkChanges( p, vFront );
            Wln_RetRetimeForward( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 1, fBackward = 0;
            fPrevFwd = 1;
        }
        else
        {
            Vec_IntAppend( vFront, vSinks );
            Wln_RetRetimeBackward( p, vFront );
            Wln_RetMarkChanges( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 0, fBackward = 1;
            fPrevBwd = 1;
        }
        DelayBest = Abc_MinInt( DelayBest, p->DelayMax );
        //Wln_RetPrint( p );
        if ( fVerbose )
            printf( "\n" );
        Wln_RetAddToMoves( p, vFront, p->DelayMax, fForward, nMoves, fSkipSimple, fVerbose );
        if ( fVerbose )
        {
            printf( "Sinks: " );
            Vec_IntPrint( &p->vSinks );
            printf( "Sources: " );
            Vec_IntPrint( &p->vSources );
        }
        if ( p->DelayMax >= DelayMaxPrev )
            nCountIncrease++;
        else
        {
            if ( nCountIncrease > 0 )
                nChange++;
            nCountIncrease = 0;
        }
        if ( nCountIncrease > 3 )
            break;
        if ( nChange > 5 )
            break;
        Wln_RetFindSources( p );
        if ( 2*Vec_IntSize(&p->vEdgeLinks) > Vec_IntCap(&p->vEdgeLinks) )
            Vec_IntGrow( &p->vEdgeLinks, 4*Vec_IntSize(&p->vEdgeLinks) );
    }
    ABC_SWAP( Vec_Int_t, *vMoves, p->vMoves );
    Wln_RetFree( p );
    if ( fVerbose )
    {
        printf( "\nThe resulting moves recorded in terms of name IDs of the NDR nodes:\n" );
        Vec_IntPrint( vMoves );
    }
    else
    {
        printf( "Retiming instruction contains %d moves and %d total retimed objects.\n", nMoves, Vec_IntSize(vMoves)-2*nMoves-2 );
        printf( "Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n", 
            DelayInit, DelayBest, DelayInit - DelayBest, 100.0 * (DelayInit - DelayBest) / DelayInit );
    }
    return vMoves;
}